

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O2

bool __thiscall SGParser::Generator::Lex::MakeDFAUsingSyntaxTree(Lex *this,DFAGen *dfa)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pbVar3;
  pointer pLVar4;
  pointer pLVar5;
  bool bVar6;
  iterator iVar7;
  DFASyntaxTree<SGParser::Generator::RegExprDFANode> *tree;
  mapped_type *ppDVar8;
  pointer __k;
  undefined1 auStack_1a8 [8];
  DFAGen testdfa;
  undefined1 local_e8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
  macroSyntaxTrees;
  String expr;
  DFASyntaxTree<SGParser::Generator::RegExprDFANode> syntaxTree;
  String local_58;
  allocator<char> local_31;
  
  pvVar1 = (dfa->super_DFA).TransitionTable.
           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (dfa->super_DFA).TransitionTable.
           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar1 == pvVar2) {
    macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&macroSyntaxTrees;
    macroSyntaxTrees._M_t._M_impl._0_4_ = 0;
    macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    __k = (this->MacroNames).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->MacroNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if ((long)pbVar3 - (long)__k >> 5 !=
        (this->Macros)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      __assert_fail("MacroNames.size() == Macros.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                    ,0x523,"bool SGParser::Generator::Lex::MakeDFAUsingSyntaxTree(DFAGen &)");
    }
    for (; __k != pbVar3; __k = __k + 1) {
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)this,__k);
      if ((_Rb_tree_header *)iVar7._M_node == &(this->Macros)._M_t._M_impl.super__Rb_tree_header) {
        __assert_fail("iter != Macros.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                      ,0x526,"bool SGParser::Generator::Lex::MakeDFAUsingSyntaxTree(DFAGen &)");
      }
      tree = (DFASyntaxTree<SGParser::Generator::RegExprDFANode> *)operator_new(0x28);
      tree->LexemeId = 0;
      tree->pRoot = (RegExprDFANode *)0x0;
      (tree->CharNodes).
      super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (tree->CharNodes).
      super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (tree->CharNodes).
      super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar6 = MakeSyntaxTree<SGParser::Generator::RegExprDFANode>
                        (this,tree,(String *)(iVar7._M_node + 2),
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                          *)local_e8);
      if (bVar6) {
        ppDVar8 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                                *)local_e8,__k);
        *ppDVar8 = tree;
      }
      else {
        DFASyntaxTree<SGParser::Generator::RegExprDFANode>::~DFASyntaxTree(tree);
        operator_delete(tree,0x28);
      }
    }
    pLVar4 = (this->Lexemes).super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pLVar5 = (this->Lexemes).super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pLVar4 != pLVar5) &&
       ((this->Expressions).
        super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->Expressions).
        super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      auStack_1a8 = (undefined1  [8])(((long)pLVar4 - (long)pLVar5) / 0x68 << 0x20);
      std::
      vector<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
      ::emplace_back<SGParser::Generator::Lex::Expression>
                (&this->Expressions,(Expression *)auStack_1a8);
    }
    expr.field_2._8_4_ = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_node_count,
               "(a|b)*(abb)+c",(allocator<char> *)auStack_1a8);
    MakeSyntaxTree<SGParser::Generator::RegExprDFANode>
              (this,(DFASyntaxTree<SGParser::Generator::RegExprDFANode> *)((long)&expr.field_2 + 8),
               (String *)&macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                *)local_e8);
    testdfa.super_DFA.CharTable._0_8_ =
         &testdfa.super_DFA.CharTable.values._M_h._M_rehash_policy._M_next_resize;
    testdfa.super_DFA.ExpressionStartStates.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    testdfa.super_DFA.ExpressionStartStates.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    testdfa.super_DFA.LexemeInfos.
    super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    testdfa.super_DFA.LexemeInfos.
    super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    testdfa.super_DFA.AcceptStates.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    testdfa.super_DFA.LexemeInfos.
    super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    testdfa.super_DFA.AcceptStates.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    testdfa.super_DFA.AcceptStates.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    testdfa.super_DFA.TransitionTable.
    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    testdfa.super_DFA.TransitionTable.
    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    auStack_1a8._0_4_ = 0;
    auStack_1a8._4_4_ = 0;
    testdfa.super_DFA.TransitionTable.
    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    testdfa.super_DFA.ExpressionStartStates.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
    testdfa.super_DFA.CharTable.values._M_h._M_buckets = (__buckets_ptr)0x1;
    testdfa.super_DFA.CharTable.values._M_h._M_bucket_count = 0;
    testdfa.super_DFA.CharTable.values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    testdfa.super_DFA.CharTable.values._M_h._M_element_count._0_4_ = 0x3f800000;
    testdfa.super_DFA.CharTable.values._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    testdfa.super_DFA.CharTable.values._M_h._M_rehash_policy._4_4_ = 0;
    testdfa.super_DFA.CharTable.values._M_h._M_rehash_policy._M_next_resize = 0;
    testdfa.super_DFA.CharTable.values._M_h._M_single_bucket._0_4_ = 0xff;
    testdfa.Messages.Flags = 0;
    testdfa.Messages._4_4_ = 0;
    testdfa.Messages.pMessages = (Messages *)0x0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"aab",&local_31);
    DFAGen::TestString((DFAGen *)auStack_1a8,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"abbbababb",&local_31);
    DFAGen::TestString((DFAGen *)auStack_1a8,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"abb",&local_31);
    DFAGen::TestString((DFAGen *)auStack_1a8,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    DFA::~DFA((DFA *)auStack_1a8);
    std::__cxx11::string::~string
              ((string *)&macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_node_count);
    DFASyntaxTree<SGParser::Generator::RegExprDFANode>::~DFASyntaxTree
              ((DFASyntaxTree<SGParser::Generator::RegExprDFANode> *)((long)&expr.field_2 + 8));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                 *)local_e8);
  }
  return pvVar1 == pvVar2;
}

Assistant:

bool Lex::MakeDFAUsingSyntaxTree(DFAGen& dfa) {
    if (dfa.IsValid())
        return false;

    // Go through all macros (in declaration-order) and create DFASyntaxTree's for them.
    // ("In declaration-order" so a lexically-later macro can refer to a lexically-earlier macro.)
    std::map<String, DFASyntaxTree<RegExprDFANode>*> macroSyntaxTrees;
    SG_ASSERT(MacroNames.size() == Macros.size());
    for (const String& name : MacroNames) {
        auto const iter = Macros.find(name);
        SG_ASSERT(iter != Macros.end());
        auto const& regExp = iter->second;

        // Create a new syntax tree
        const auto ptree = new DFASyntaxTree<RegExprDFANode>;

        // if the nfa failed to initialize then quite
        if (MakeSyntaxTree(*ptree, regExp, macroSyntaxTrees))
            macroSyntaxTrees[name] = ptree;
        else
            delete ptree; // Should we report an error?
    }

    // If there are lexemes, but not a single expression
    // make an expression for them (special case)
    if (Lexemes.size() && !Expressions.size())
        Expressions.push_back({0u, unsigned(Lexemes.size())});

    DFASyntaxTree<RegExprDFANode> syntaxTree;
    const String expr = "(a|b)*(abb)+c";

    MakeSyntaxTree(syntaxTree, expr, macroSyntaxTrees);

    const DFAGen testdfa;

    [[maybe_unused]] unsigned r;
    r = testdfa.TestString("aab");
    r = testdfa.TestString("abbbababb");
    r = testdfa.TestString("abb");

    return true;
}